

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2File(LWOImporter *this)

{
  ushort *puVar1;
  _List_node_base **out;
  uint uVar2;
  _List_node_base *p_Var3;
  uint8_t *puVar4;
  pointer paVar5;
  pointer paVar6;
  pointer pFVar7;
  pointer pFVar8;
  uint8_t **ppuVar9;
  bool bVar10;
  ushort uVar11;
  ChunkHeader CVar12;
  Logger *this_00;
  DeadlyImportError *pDVar13;
  uint *puVar14;
  ushort *puVar15;
  undefined8 extraout_RDX;
  uint32_t uVar16;
  char *message;
  ushort *puVar17;
  uint length;
  allocator local_1c1;
  list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *local_1c0;
  uint8_t **local_1b8;
  _List_node_base *local_1b0;
  undefined4 local_1a4;
  uint *local_1a0;
  LWOImporter *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  char buffer [128];
  
  local_1b8 = &this->mFileBuffer;
  puVar17 = (ushort *)this->mFileBuffer;
  puVar15 = (ushort *)((ulong)this->fileSize + (long)puVar17);
  local_190 = &this->configLayerName;
  local_1a0 = (uint *)0x0;
  local_1c0 = (list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
              ((ulong)local_1c0 & 0xffffffff00000000);
  local_198 = this;
  do {
    ppuVar9 = local_1b8;
    if (puVar15 < puVar17 + 4) {
      return;
    }
    CVar12 = IFF::LoadChunk(local_1b8);
    puVar17 = (ushort *)(*ppuVar9 + ((ulong)CVar12 >> 0x20));
    if (puVar15 < puVar17) {
      pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)buffer,"LWO2: Chunk length points behind the file",&local_1c1);
      DeadlyImportError::DeadlyImportError(pDVar13,(string *)buffer);
      __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((ulong)CVar12 >> 0x20 != 0) {
      uVar16 = CVar12.type;
      length = CVar12.length;
      if (uVar16 == 0x434c4950) {
        LoadLWO2Clip(this,length);
      }
      else if (uVar16 == 0x454e564c) {
        LoadLWO2Envelope(this,length);
      }
      else if (uVar16 == 0x564d4150) {
LAB_00404afc:
        if (((ulong)local_1c0 & 1) == 0) {
          if ((this->mCurLayer->mTempPoints).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (this->mCurLayer->mTempPoints).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_00 = DefaultLogger::get();
            message = "LWO2: Unexpected VMAP chunk";
            goto LAB_00404d29;
          }
          LoadLWO2VertexMap(this,length,uVar16 == 0x564d4144);
        }
      }
      else if (uVar16 == 0x504e5453) {
        if (((ulong)local_1c0 & 1) == 0) {
          paVar5 = (this->mCurLayer->mTempPoints).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          paVar6 = (this->mCurLayer->mTempPoints).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          LoadLWOPoints(this,length);
          this->mCurLayer->mPointIDXOfs = (uint)(((long)paVar5 - (long)paVar6) / 0xc);
        }
      }
      else if (uVar16 == 0x504f4c53) {
        if (((ulong)local_1c0 & 1) == 0) {
          pFVar7 = (this->mCurLayer->mFaces).
                   super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          pFVar8 = (this->mCurLayer->mFaces).
                   super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl
                   .super__Vector_impl_data._M_start;
          LoadLWO2Polygons(this,length);
          this->mCurLayer->mFaceIDXOfs = (uint)((ulong)((long)pFVar7 - (long)pFVar8) >> 5);
        }
      }
      else if (uVar16 == 0x50544147) {
        if (((ulong)local_1c0 & 1) == 0) {
          if ((this->mCurLayer->mFaces).
              super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (this->mCurLayer->mFaces).
              super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_00 = DefaultLogger::get();
            message = "LWO2: Unexpected PTAG";
            goto LAB_00404d29;
          }
          LoadLWO2PolygonTags(this,length);
        }
      }
      else if (uVar16 == 0x53555246) {
        LoadLWO2Surface(this,length);
      }
      else if (uVar16 == 0x54414753) {
        if ((this->mTags->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (this->mTags->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          this_00 = DefaultLogger::get();
          message = "LWO2: SRFS chunk encountered twice";
          goto LAB_00404d29;
        }
        LoadLWOTags(this,length);
      }
      else if (uVar16 == 0x564d4144) {
        if ((this->mCurLayer->mFaces).
            super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (this->mCurLayer->mFaces).
            super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00404afc;
        this_00 = DefaultLogger::get();
        message = "LWO2: Unexpected VMAD chunk";
LAB_00404d29:
        Logger::warn(this_00,message);
      }
      else {
        if (uVar16 != 0x4c415952) goto LAB_00404d31;
        local_1c0 = this->mLayers;
        LWO::Layer::Layer((Layer *)buffer);
        std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::push_back
                  (local_1c0,(Layer *)buffer);
        LWO::Layer::~Layer((Layer *)buffer);
        this = local_198;
        p_Var3 = (local_198->mLayers->
                 super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>)._M_impl.
                 _M_node.super__List_node_base._M_prev;
        local_198->mCurLayer = (Layer *)(p_Var3 + 1);
        if ((ulong)CVar12 >> 0x24 == 0) {
          pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)buffer,"LWO: LAYR chunk is too small",&local_1c1);
          DeadlyImportError::DeadlyImportError(pDVar13,(string *)buffer);
          __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar11 = *(ushort *)local_198->mFileBuffer;
        uVar11 = uVar11 << 8 | uVar11 >> 8;
        local_198->mFileBuffer = (uint8_t *)((long)local_198->mFileBuffer + 2);
        *(ushort *)((long)&p_Var3[0x13]._M_next + 2) = uVar11;
        if ((local_198->configLayerIndex == 0xffffffff) ||
           (local_1a4 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1),
           local_198->configLayerIndex - 1 == (uint)uVar11)) {
          local_1a4 = 0;
        }
        puVar4 = local_198->mFileBuffer;
        local_198->mFileBuffer = puVar4 + 2;
        uVar2 = *(uint *)(puVar4 + 2);
        local_198->mFileBuffer = puVar4 + 6;
        (local_198->mCurLayer->mPivot).x =
             (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
                    );
        uVar2 = *(uint *)local_198->mFileBuffer;
        local_198->mFileBuffer = (uint8_t *)((long)local_198->mFileBuffer + 4);
        (local_198->mCurLayer->mPivot).y =
             (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
                    );
        uVar2 = *(uint *)local_198->mFileBuffer;
        puVar14 = (uint *)((long)local_198->mFileBuffer + 4);
        local_198->mFileBuffer = (uint8_t *)puVar14;
        (local_198->mCurLayer->mPivot).z =
             (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
                    );
        out = &p_Var3[0x13]._M_prev;
        local_1b0 = p_Var3;
        GetS0(local_198,(string *)out,length - 0x10);
        if (local_1b0[0x14]._M_next == (_List_node_base *)0x0) {
          local_1c0 = (list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                      CONCAT44(local_1c0._4_4_,(int)local_1a0 + 1);
          puVar14 = local_1a0;
          snprintf(buffer,0x80,"Layer_%i");
          this = local_198;
          std::__cxx11::string::assign((char *)out);
          local_1a0 = (uint *)((ulong)local_1c0 & 0xffffffff);
        }
        if ((this->configLayerName)._M_string_length == 0) {
LAB_00404cc1:
          this->hasNamedLayer = true;
          local_1c0 = (list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                      CONCAT44(local_1c0._4_4_,local_1a4);
        }
        else {
          bVar10 = std::operator!=(local_190,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)out);
          local_1c0 = (list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                      CONCAT44(local_1c0._4_4_,(int)CONCAT71((int7)((ulong)puVar14 >> 8),1));
          if (!bVar10) goto LAB_00404cc1;
        }
        puVar1 = (ushort *)((long)*local_1b8 + 2);
        uVar11 = 0xffff;
        if (puVar1 <= puVar17) {
          uVar11 = *(ushort *)*local_1b8;
          *local_1b8 = (uint8_t *)puVar1;
          uVar11 = uVar11 << 8 | uVar11 >> 8;
        }
        *(ushort *)&local_1b0[0x13]._M_next = uVar11;
        *(char *)((long)&local_1b0[0x16]._M_next + 4) = (char)local_1c0;
      }
    }
LAB_00404d31:
    *local_1b8 = (uint8_t *)puVar17;
  } while( true );
}

Assistant:

void LWOImporter::LoadLWO2File()
{
    bool skip = false;

    LE_NCONST uint8_t* const end = mFileBuffer + fileSize;
    unsigned int iUnnamed = 0;
    while (true)
    {
        if (mFileBuffer + sizeof(IFF::ChunkHeader) > end)break;
        const IFF::ChunkHeader head = IFF::LoadChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
        {
            throw DeadlyImportError("LWO2: Chunk length points behind the file");
            break;
        }
        uint8_t* const next = mFileBuffer+head.length;

        if(!head.length) {
            mFileBuffer = next;
            continue;
        }

        switch (head.type)
        {
            // new layer
        case AI_LWO_LAYR:
            {
                // add a new layer to the list ....
                mLayers->push_back ( LWO::Layer() );
                LWO::Layer& layer = mLayers->back();
                mCurLayer = &layer;

                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LAYR,16);

                // layer index.
                layer.mIndex = GetU2();

                // Continue loading this layer or ignore it? Check the layer index property
                if (UINT_MAX != configLayerIndex && (configLayerIndex-1) != layer.mIndex)   {
                    skip = true;
                }
                else skip = false;

                // pivot point
                mFileBuffer += 2; /* unknown */
                mCurLayer->mPivot.x = GetF4();
                mCurLayer->mPivot.y = GetF4();
                mCurLayer->mPivot.z = GetF4();
                GetS0(layer.mName,head.length-16);

                // if the name is empty, generate a default name
                if (layer.mName.empty())    {
                    char buffer[128]; // should be sufficiently large
                    ::ai_snprintf(buffer, 128, "Layer_%i", iUnnamed++);
                    layer.mName = buffer;
                }

                // load this layer or ignore it? Check the layer name property
                if (configLayerName.length() && configLayerName != layer.mName) {
                    skip = true;
                }
                else hasNamedLayer = true;

                // optional: parent of this layer
                if (mFileBuffer + 2 <= next)
                    layer.mParent = GetU2();
                else layer.mParent = -1;

                // Set layer skip parameter
                layer.skip = skip;

                break;
            }

            // vertex list
        case AI_LWO_PNTS:
            {
                if (skip)
                    break;

                unsigned int old = (unsigned int)mCurLayer->mTempPoints.size();
                LoadLWOPoints(head.length);
                mCurLayer->mPointIDXOfs = old;
                break;
            }
            // vertex tags
        case AI_LWO_VMAD:
            if (mCurLayer->mFaces.empty())
            {
                ASSIMP_LOG_WARN("LWO2: Unexpected VMAD chunk");
                break;
            }
            // --- intentionally no break here
        case AI_LWO_VMAP:
            {
                if (skip)
                    break;

                if (mCurLayer->mTempPoints.empty())
                    ASSIMP_LOG_WARN("LWO2: Unexpected VMAP chunk");
                else LoadLWO2VertexMap(head.length,head.type == AI_LWO_VMAD);
                break;
            }
            // face list
        case AI_LWO_POLS:
            {
                if (skip)
                    break;

                unsigned int old = (unsigned int)mCurLayer->mFaces.size();
                LoadLWO2Polygons(head.length);
                mCurLayer->mFaceIDXOfs = old;
                break;
            }
            // polygon tags
        case AI_LWO_PTAG:
            {
                if (skip)
                    break;

                if (mCurLayer->mFaces.empty()) {
                    ASSIMP_LOG_WARN("LWO2: Unexpected PTAG");
                } else {
                    LoadLWO2PolygonTags(head.length);
                }
                break;
            }
            // list of tags
        case AI_LWO_TAGS:
            {
                if (!mTags->empty()) {
                    ASSIMP_LOG_WARN("LWO2: SRFS chunk encountered twice");
                }   else {
                    LoadLWOTags(head.length);
                }
                break;
            }

            // surface chunk
        case AI_LWO_SURF:
            {
                LoadLWO2Surface(head.length);
                break;
            }

            // clip chunk
        case AI_LWO_CLIP:
            {
                LoadLWO2Clip(head.length);
                break;
            }

            // envelope chunk
        case AI_LWO_ENVL:
            {
                LoadLWO2Envelope(head.length);
                break;
            }
        }
        mFileBuffer = next;
    }
}